

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifySolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  element_type *peVar3;
  long in_RDI;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  Verbosity old_verbosity;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc98;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffca0;
  longlong in_stack_fffffffffffffca8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffcb0;
  type_conflict5 local_339;
  Verbosity local_330;
  Verbosity local_32c;
  undefined1 local_328 [56];
  undefined1 local_2f0 [56];
  undefined1 local_2b8 [56];
  undefined1 local_280 [40];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffda8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdb0;
  Verbosity in_stack_fffffffffffffdb8;
  Verbosity in_stack_fffffffffffffdbc;
  undefined4 local_21c;
  undefined1 local_218 [48];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe18;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe24;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe3f;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 uVar5;
  undefined1 local_1a0 [56];
  undefined4 local_168;
  undefined1 local_164 [56];
  undefined4 local_12c;
  undefined1 local_128 [56];
  Verbosity local_f0;
  Verbosity local_ec [3];
  undefined8 local_e0;
  undefined4 *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined4 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined4 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
    local_ec[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
    local_f0 = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_f0);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffc98);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_ec);
  }
  local_12c = 0;
  local_d0 = local_128;
  local_d8 = &local_12c;
  local_e0 = 0;
  local_8 = local_d8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  local_168 = 0;
  local_b8 = local_164;
  local_c0 = &local_168;
  local_c8 = 0;
  local_10 = local_c0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  uVar5 = 0;
  local_a0 = local_1a0;
  local_a8 = &stack0xfffffffffffffe5c;
  local_b0 = 0;
  local_18 = local_a8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  uVar4 = 0;
  local_88 = &stack0xfffffffffffffe24;
  local_90 = &stack0xfffffffffffffe20;
  local_98 = 0;
  local_20 = local_90;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  local_21c = 0;
  local_70 = local_218;
  local_78 = &local_21c;
  local_80 = 0;
  local_28 = local_78;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  getBoundViolation((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                    in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  getRowViolation(in_stack_fffffffffffffe28,
                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)CONCAT44(in_stack_fffffffffffffe24,uVar4),in_stack_fffffffffffffe18);
  getDualViolation((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(uVar5,in_stack_fffffffffffffe58),in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48);
  getRedCostViolation((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(uVar5,in_stack_fffffffffffffe58),in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe48);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(in_RDI + 0x180));
  peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x478085);
  Tolerances::floatingPointFeastol(peVar3);
  tVar1 = boost::multiprecision::operator>=
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffffc98,(double *)0x4780ab);
  local_339 = true;
  if (!tVar1) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(in_RDI + 0x180));
    peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4780d5);
    Tolerances::floatingPointFeastol(peVar3);
    tVar1 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffc98,(double *)0x4780fb);
    local_339 = true;
    if (!tVar1) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(in_RDI + 0x180));
      peVar3 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x478125);
      Tolerances::floatingPointOpttol(peVar3);
      tVar1 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffc98,(double *)0x47814b);
      local_339 = true;
      if (!tVar1) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x180));
        peVar3 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x478171);
        Tolerances::floatingPointOpttol(peVar3);
        local_339 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffffc98,(double *)0x478197);
      }
    }
  }
  if (local_339 != false) {
    if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 4 < (int)VVar2)) {
      SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffdb8);
      in_stack_fffffffffffffca0 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                                 (char *)in_stack_fffffffffffffc98);
      local_60 = local_280;
      local_68 = local_164;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      local_50 = local_2b8;
      local_58 = local_1a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      local_40 = local_2f0;
      local_48 = &stack0xfffffffffffffe24;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      local_30 = local_328;
      local_38 = local_218;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffc98);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xfffffffffffffdbc);
    }
    if ((in_RDI != -8) && (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar2)) {
      local_32c = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_330 = INFO1;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_330);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffca0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffc98);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_32c);
    }
    if ((*(byte *)(in_RDI + 0x5071) & 1) != 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::unscaleLPandReloadBasis(in_stack_fffffffffffffca0);
      *(undefined1 *)(in_RDI + 0x5071) = 0;
      *(int *)(in_RDI + 0x5e28) = *(int *)(in_RDI + 0x5e28) + 1;
    }
    _preprocessAndSolveReal
              (in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f,in_stack_fffffffffffffe30);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}